

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

string * __thiscall Assimp::FIBase64ValueImpl::toString_abi_cxx11_(FIBase64ValueImpl *this)

{
  byte bVar1;
  pointer puVar2;
  pointer puVar3;
  byte bVar4;
  int iVar5;
  ostream *poVar6;
  size_type i;
  long lVar7;
  string asStack_1c8 [32];
  ostringstream os;
  
  if (this->strValueValid == false) {
    this->strValueValid = true;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
    puVar2 = (this->super_FIBase64Value).super_FIByteValue.value.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar3 = (this->super_FIBase64Value).super_FIByteValue.value.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar5 = 0;
    bVar4 = 0;
    for (lVar7 = 0; (long)puVar2 - (long)puVar3 != lVar7; lVar7 = lVar7 + 1) {
      bVar1 = (this->super_FIBase64Value).super_FIByteValue.value.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7];
      if (iVar5 == 2) {
        poVar6 = std::operator<<((ostream *)&os,
                                 "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                                 [(ulong)(bVar1 >> 6) + (ulong)(bVar4 & 0xf) * 4]);
        iVar5 = 0;
        std::operator<<(poVar6,"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                               [bVar1 & 0x3f]);
      }
      else if (iVar5 == 1) {
        std::operator<<((ostream *)&os,
                        "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                        [(byte)((bVar4 & 3) << 4 | bVar1 >> 4)]);
        iVar5 = 2;
      }
      else {
        std::operator<<((ostream *)&os,
                        "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                        [bVar1 >> 2]);
        iVar5 = 1;
      }
      bVar4 = bVar1;
    }
    if (iVar5 == 1) {
      poVar6 = std::operator<<((ostream *)&os,
                               "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                               [(byte)(bVar4 << 4) & 0x30]);
      std::operator<<(poVar6,"==");
    }
    else if (iVar5 == 2) {
      poVar6 = std::operator<<((ostream *)&os,
                               "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                               [(byte)(bVar4 << 2) & 0x3c]);
      std::operator<<(poVar6,'=');
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->strValue,asStack_1c8);
    std::__cxx11::string::~string(asStack_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  }
  return &this->strValue;
}

Assistant:

virtual const std::string &toString() const /*override*/ {
        if (!strValueValid) {
            strValueValid = true;
            std::ostringstream os;
            uint8_t c1 = 0, c2;
            int imod3 = 0;
            std::vector<uint8_t>::size_type valueSize = value.size();
            for (std::vector<uint8_t>::size_type i = 0; i < valueSize; ++i) {
                c2 = value[i];
                switch (imod3) {
                case 0:
                    os << basis_64[c2 >> 2];
                    imod3 = 1;
                    break;
                case 1:
                    os << basis_64[((c1 & 0x03) << 4) | ((c2 & 0xf0) >> 4)];
                    imod3 = 2;
                    break;
                case 2:
                    os << basis_64[((c1 & 0x0f) << 2) | ((c2 & 0xc0) >> 6)] << basis_64[c2 & 0x3f];
                    imod3 = 0;
                    break;
                }
                c1 = c2;
            }
            switch (imod3) {
            case 1:
                os << basis_64[(c1 & 0x03) << 4] << "==";
                break;
            case 2:
                os << basis_64[(c1 & 0x0f) << 2] << '=';
                break;
            }
            strValue = os.str();
        }
        return strValue;
    }